

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O3

string * __thiscall
higan::HttpResponse::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,HttpResponse *this,StatusCode status_code)

{
  char *pcVar1;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = "500 Internal Server Error";
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"500 Internal Server Error","");
  iVar2 = (int)this;
  if (iVar2 < 0x194) {
    if (iVar2 == 200) {
      pcVar1 = "200 OK";
    }
    else {
      if (iVar2 != 400) {
        return __return_storage_ptr__;
      }
      pcVar1 = "400 Bad Request";
    }
  }
  else if (iVar2 == 0x194) {
    pcVar1 = "404 Not Found";
  }
  else if (iVar2 != 500) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpResponse::StatusCodeToString(HttpResponse::StatusCode status_code)
{
	std::string result = "500 Internal Server Error";
	switch (status_code)
	{
		case STATUS_200_OK:
			result = "200 OK";
			break;
		case STATUS_400_BAD_REQUEST:
			result = "400 Bad Request";
			break;
		case STATUS_404_NOT_FOUND:
			result = "404 Not Found";
			break;
		case STATUS_500_SERVICE_ERROR:
			result = "500 Internal Server Error";
			break;
	}

	return result;
}